

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint pixel_dist(AV1_COMP *cpi,MACROBLOCK *x,int plane,uint8_t *src,int src_stride,uint8_t *dst,
               int dst_stride,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,BLOCK_SIZE tx_bsize)

{
  uint uVar1;
  AV1_COMP *cpi_00;
  int *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  undefined4 in_R8D;
  int *in_R9;
  uint sse;
  MACROBLOCKD *xd;
  int visible_cols;
  int visible_rows;
  int txb_cols;
  int txb_rows;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_48;
  undefined1 local_44 [4];
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd8;
  
  cpi_00 = (AV1_COMP *)(in_RSI + 0x1a0);
  uVar2 = (undefined4)((ulong)&stack0xffffffffffffffb0 >> 0x20);
  get_txb_dimensions((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (int)((ulong)cpi_00 >> 0x20),(BLOCK_SIZE)((ulong)cpi_00 >> 0x18),
                     in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                     (BLOCK_SIZE)((uint)in_stack_ffffffffffffff9c >> 0x18),in_R9,
                     (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),in_RCX,
                     (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
  uVar1 = pixel_dist_visible_only
                    (cpi_00,(MACROBLOCK *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffffb0),
                     (int)((ulong)&stack0xffffffffffffffb4 >> 0x20),
                     (uint8_t *)CONCAT44(uVar2,local_48),(int)((ulong)local_44 >> 0x20),
                     (BLOCK_SIZE)in_R9,in_stack_ffffffffffffffc8,(int)in_RCX,
                     in_stack_ffffffffffffffd8,(int)in_RSI);
  return uVar1;
}

Assistant:

static unsigned pixel_dist(const AV1_COMP *const cpi, const MACROBLOCK *x,
                           int plane, const uint8_t *src, const int src_stride,
                           const uint8_t *dst, const int dst_stride,
                           int blk_row, int blk_col,
                           const BLOCK_SIZE plane_bsize,
                           const BLOCK_SIZE tx_bsize) {
  int txb_rows, txb_cols, visible_rows, visible_cols;
  const MACROBLOCKD *xd = &x->e_mbd;

  get_txb_dimensions(xd, plane, plane_bsize, blk_row, blk_col, tx_bsize,
                     &txb_cols, &txb_rows, &visible_cols, &visible_rows);
  assert(visible_rows > 0);
  assert(visible_cols > 0);

  unsigned sse = pixel_dist_visible_only(cpi, x, src, src_stride, dst,
                                         dst_stride, tx_bsize, txb_rows,
                                         txb_cols, visible_rows, visible_cols);

  return sse;
}